

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O1

void sbfTport_parseWeights(sbfTport tport)

{
  sbfKeyValue psVar1;
  int iVar2;
  char *__s;
  char *pcVar3;
  ulong uVar4;
  sbfTportWeight *psVar5;
  ulong __n;
  sbfLog psVar6;
  uint uVar7;
  ulong uVar8;
  char *endptr;
  char pattern [256];
  char name [64];
  char *local_180;
  char local_178 [256];
  char local_78 [72];
  
  psVar1 = tport->mProperties;
  uVar8 = 0;
  do {
    snprintf(local_78,0x40,"weight%u",uVar8);
    __s = (char *)sbfKeyValue_get(psVar1,local_78);
    if (__s != (char *)0x0) {
      pcVar3 = strchr(__s,0x2c);
      if (pcVar3 == (char *)0x0) {
        sbfLog_log(tport->mLog,2,"missing comma in weight%u property (%s)",uVar8,__s);
      }
      else {
        uVar4 = strtoul(pcVar3 + 1,&local_180,10);
        if ((uVar4 < 0x10000) && ((local_180 == (char *)0x0 || (*local_180 == '\0')))) {
          __n = (long)pcVar3 - (long)__s;
          if (__n < 0x100) {
            memcpy(local_178,__s,__n);
            local_178[__n] = '\0';
            psVar5 = (sbfTportWeight *)
                     sbfMemory_realloc(tport->mWeightsList,tport->mWeightsListSize + 1,0x48);
            tport->mWeightsList = psVar5;
            uVar7 = tport->mWeightsListSize;
            tport->mWeightsListSize = uVar7 + 1;
            iVar2 = regcomp((regex_t *)&psVar5[uVar7].mPattern,local_178,9);
            if (iVar2 == 0) {
              psVar5[uVar7].mWeight = (u_int)uVar4;
              sbfLog_log(tport->mLog,0,"weight pattern %s is %u",local_178,uVar4 & 0xffffffff);
            }
            else {
              sbfLog_log(tport->mLog,2,"weight%u pattern is invalid (%s)",uVar8,__s);
              tport->mWeightsListSize = tport->mWeightsListSize - 1;
            }
            goto LAB_001061bd;
          }
          psVar6 = tport->mLog;
          pcVar3 = "weight%u pattern is too long (%s)";
        }
        else {
          psVar6 = tport->mLog;
          pcVar3 = "bad number in weight%u property (%s)";
        }
        sbfLog_log(psVar6,2,pcVar3,uVar8,__s);
      }
    }
LAB_001061bd:
    uVar7 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar7;
    if (uVar7 == 0xffff) {
      return;
    }
  } while( true );
}

Assistant:

void
sbfTport_parseWeights (sbfTport tport)
{
    sbfKeyValue      properties = tport->mProperties;
    u_int            i;
    char             name[64];
    const char*      value;
    const char*      cp;
    char             pattern[256];
    unsigned long    ul;
    char*            endptr;
    sbfTportWeight*  w;

    for (i = 0; i < USHRT_MAX; i++)
    {
        snprintf (name, sizeof name, "weight%u", i);
        if ((value = sbfKeyValue_get (properties, name)) == NULL)
            continue;
        cp = strchr (value, ',');
        if (cp == NULL)
        {
            sbfLog_warn (tport->mLog,
                         "missing comma in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        ul = strtoul (cp + 1, &endptr, 10);
        if (ul > USHRT_MAX || (endptr != NULL && *endptr != '\0'))
        {
            sbfLog_warn (tport->mLog,
                         "bad number in weight%u property (%s)",
                         i,
                         value);
            continue;
        }

        if ((size_t)(cp - value) > (sizeof pattern) - 1)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is too long (%s)",
                         i,
                         value);
            continue;
        }
        memcpy (pattern, value, cp - value);
        pattern[cp - value] = '\0';

        tport->mWeightsList = xrealloc (tport->mWeightsList,
                                        tport->mWeightsListSize + 1,
                                        sizeof *tport->mWeightsList);
        w = &tport->mWeightsList[tport->mWeightsListSize++];

        if (regcomp (&w->mPattern, pattern, REG_EXTENDED|REG_NOSUB) != 0)
        {
            sbfLog_warn (tport->mLog,
                         "weight%u pattern is invalid (%s)",
                         i,
                         value);
            tport->mWeightsListSize--;
            continue;
        }
        w->mWeight = ul;
        sbfLog_debug (tport->mLog,
                      "weight pattern %s is %u",
                      pattern,
                      w->mWeight);
    }

}